

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  ImVec2 *mouse_pos;
  uint remaining;
  int iVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiPopupData *pIVar6;
  ImVec2 IVar7;
  ImGuiContext_conflict1 *pIVar8;
  _Bool _Var9;
  int iVar10;
  ImGuiPopupData *pIVar11;
  int iVar12;
  long lVar13;
  ImGuiContext_conflict1 *g;
  int iVar14;
  ImVec2 *pIVar15;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  remaining = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) == 0) || ((GImGui->OpenPopupStack).Size <= (int)remaining)) {
    lVar13 = (long)(GImGui->CurrentWindow->IDStack).Size;
    if (lVar13 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x70f,"T &ImVector<unsigned int>::back() [T = unsigned int]");
    }
    pIVar4 = (ImGuiWindow *)GImGui->NavWindow;
    iVar2 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[lVar13 + -1];
    IVar7 = NavCalcPreferredRefPos();
    mouse_pos = &(pIVar8->IO).MousePos;
    local_38 = IVar7;
    _Var9 = IsMousePosValid(mouse_pos);
    pIVar15 = &local_38;
    if (_Var9) {
      pIVar15 = mouse_pos;
    }
    IVar5 = *pIVar15;
    iVar10 = (pIVar8->OpenPopupStack).Size;
    if ((int)remaining < iVar10) {
      if ((int)remaining < 0) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]");
      }
      pIVar11 = (pIVar8->OpenPopupStack).Data;
      if ((pIVar11[remaining].PopupId == id) &&
         (pIVar11[remaining].OpenFrameCount == pIVar8->FrameCount + -1)) {
        pIVar11[remaining].OpenFrameCount = iVar2;
        return;
      }
      ClosePopupToLevel(remaining,false);
      iVar10 = (pIVar8->OpenPopupStack).Size;
    }
    if (iVar10 == (pIVar8->OpenPopupStack).Capacity) {
      if (iVar10 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar10 / 2 + iVar10;
      }
      iVar14 = iVar10 + 1;
      if (iVar10 + 1 < iVar12) {
        iVar14 = iVar12;
      }
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar11 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData)
      ;
      pIVar6 = (pIVar8->OpenPopupStack).Data;
      if (pIVar6 != (ImGuiPopupData *)0x0) {
        memcpy(pIVar11,pIVar6,(long)(pIVar8->OpenPopupStack).Size * 0x30);
        pIVar6 = (pIVar8->OpenPopupStack).Data;
        if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (pIVar8->OpenPopupStack).Data = pIVar11;
      (pIVar8->OpenPopupStack).Capacity = iVar14;
      iVar10 = (pIVar8->OpenPopupStack).Size;
    }
    else {
      pIVar11 = (pIVar8->OpenPopupStack).Data;
    }
    pIVar11[iVar10].PopupId = id;
    *(undefined4 *)&pIVar11[iVar10].field_0x4 = 0;
    pIVar11[iVar10].Window = (ImGuiWindow *)0x0;
    pIVar11[iVar10].SourceWindow = pIVar4;
    pIVar11[iVar10].OpenFrameCount = iVar2;
    pIVar11[iVar10].OpenParentId = uVar3;
    pIVar11[iVar10].OpenPopupPos = IVar7;
    pIVar11[iVar10].OpenMousePos = IVar5;
    (pIVar8->OpenPopupStack).Size = (pIVar8->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}